

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive.cpp
# Opt level: O2

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::GeometricPrimitive::Intersect
          (optional<pbrt::ShapeIntersection> *__return_storage_ptr__,GeometricPrimitive *this,Ray *r
          ,Float tMax)

{
  undefined1 auVar1 [16];
  ShapeIntersection *pSVar2;
  uint64_t uVar3;
  Float FVar4;
  float fVar5;
  undefined1 in_XMM4 [16];
  Float va;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float fStack_1f8;
  undefined8 uStack_1f4;
  MediumHandle local_1e8;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_1e0;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_1d8;
  TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  local_1d0;
  double vb;
  float fStack_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  TStack_1a8;
  bool bStack_1a0;
  undefined3 uStack_19f;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  Tuple3<pbrt::Point3,_float> aTStack_190 [3];
  optional<pbrt::ShapeIntersection> si;
  double local_60 [4];
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  TStack_40;
  bool bStack_38;
  undefined3 uStack_37;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float fStack_28;
  float fStack_24;
  
  ShapeHandle::Intersect(&si,&this->shape,r,tMax);
  if (si.set == false) {
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  }
  else {
    pSVar2 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
    vb = (double)tMax * 1.001;
    _va = (double)CONCAT44(fStack_204,pSVar2->tHit);
    if (vb <= (double)pSVar2->tHit) {
      LogFatal<char_const(&)[9],char_const(&)[13],char_const(&)[9],float&,char_const(&)[13],double&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/primitive.cpp"
                 ,0x39,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [9])"si->tHit",
                 (char (*) [13])"1.001 * tMax",(char (*) [9])"si->tHit",&va,
                 (char (*) [13])"1.001 * tMax",&vb);
    }
    if (((this->alpha).
         super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
         .bits & 0xffffffffffff) != 0) {
      pSVar2 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
      TextureEvalContext::TextureEvalContext((TextureEvalContext *)local_60,&pSVar2->intr);
      vb = local_60[0];
      fStack_1c0 = SUB84(local_60[1],0);
      fStack_1bc = (float)((ulong)local_60[1] >> 0x20);
      fStack_1b8 = SUB84(local_60[2],0);
      fStack_1b4 = (float)((ulong)local_60[2] >> 0x20);
      fStack_1b0 = SUB84(local_60[3],0);
      fStack_1ac = (float)((ulong)local_60[3] >> 0x20);
      TStack_1a8.bits = TStack_40.bits;
      bStack_1a0 = bStack_38;
      uStack_19f = uStack_37;
      fStack_19c = fStack_34;
      fStack_198 = fStack_30;
      fStack_194 = fStack_2c;
      aTStack_190[0].x = fStack_28;
      aTStack_190[0].y = fStack_24;
      FVar4 = TaggedPointer<pbrt::FloatImageTexture,pbrt::GPUFloatImageTexture,pbrt::FloatMixTexture,pbrt::FloatScaledTexture,pbrt::FloatConstantTexture,pbrt::FloatBilerpTexture,pbrt::FloatCheckerboardTexture,pbrt::FloatDotsTexture,pbrt::FBmTexture,pbrt::FloatPtexTexture,pbrt::WindyTexture,pbrt::WrinkledTexture>
              ::
              Dispatch<pbrt::FloatTextureHandle::Evaluate(pbrt::TextureEvalContext)const::_lambda(auto:1)_1_>
                        ((TaggedPointer<pbrt::FloatImageTexture,pbrt::GPUFloatImageTexture,pbrt::FloatMixTexture,pbrt::FloatScaledTexture,pbrt::FloatConstantTexture,pbrt::FloatBilerpTexture,pbrt::FloatCheckerboardTexture,pbrt::FloatDotsTexture,pbrt::FBmTexture,pbrt::FloatPtexTexture,pbrt::WindyTexture,pbrt::WrinkledTexture>
                          *)&this->alpha,(TextureEvalContext *)&vb);
      fVar5 = 1.0;
      if (FVar4 < 1.0) {
        if (0.0 < FVar4) {
          uVar3 = Hash<pbrt::Point3<float>,pbrt::Vector3<float>>
                            ((Point3<float>)(r->o).super_Tuple3<pbrt::Point3,_float>,
                             (Vector3<float>)(r->d).super_Tuple3<pbrt::Vector3,_float>);
          auVar1 = vcvtusi2ss_avx512f(in_XMM4,(int)uVar3);
          fVar5 = auVar1._0_4_ * 2.3283064e-10;
        }
        if (FVar4 < fVar5) {
          pSVar2 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
          Interaction::SpawnRay((RayDifferential *)&vb,(Interaction *)pSVar2,&r->d);
          uStack_1f4._4_4_ = fStack_1b0;
          uStack_1f4._0_4_ = fStack_1b4;
          fStack_1f8 = fStack_1b8;
          _va = vb;
          fStack_200 = fStack_1c0;
          fStack_1fc = fStack_1bc;
          local_1e8.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                   )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                     )TStack_1a8.bits;
          pSVar2 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
          Intersect(__return_storage_ptr__,this,(Ray *)&va,tMax - pSVar2->tHit);
          if (__return_storage_ptr__->set == true) {
            pSVar2 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
            fVar5 = pSVar2->tHit;
            pSVar2 = pstd::optional<pbrt::ShapeIntersection>::value(__return_storage_ptr__);
            pSVar2->tHit = fVar5 + pSVar2->tHit;
          }
          goto LAB_0041d271;
        }
      }
    }
    pSVar2 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
    local_1d0.bits =
         (this->material).
         super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
         .bits;
    local_1d8.bits =
         (this->areaLight).
         super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
         .bits;
    local_1e0.bits =
         (r->medium).
         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
         .bits;
    SurfaceInteraction::SetIntersectionProperties
              (&pSVar2->intr,(MaterialHandle *)&local_1d0,(LightHandle *)&local_1d8,
               &this->mediumInterface,(MediumHandle *)&local_1e0);
    pstd::optional<pbrt::ShapeIntersection>::optional(__return_storage_ptr__,&si);
  }
LAB_0041d271:
  pstd::optional<pbrt::ShapeIntersection>::~optional(&si);
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<ShapeIntersection> GeometricPrimitive::Intersect(const Ray &r,
                                                                Float tMax) const {
    pstd::optional<ShapeIntersection> si = shape.Intersect(r, tMax);
    if (!si)
        return {};
    CHECK_LT(si->tHit, 1.001 * tMax);
    // Test intersection against alpha texture, if present
    if (alpha) {
        if (Float a = alpha.Evaluate(si->intr); a < 1) {
            // Potentially skip intersection, depending on stochastic alpha test
            Float u = (a <= 0) ? 1.f : (uint32_t(Hash(r.o, r.d)) * 0x1p-32f);
            if (u > a) {
                // Ignore this intersection and trace a new ray
                Ray rNext = si->intr.SpawnRay(r.d);
                pstd::optional<ShapeIntersection> siNext =
                    Intersect(rNext, tMax - si->tHit);
                if (siNext)
                    siNext->tHit += si->tHit;
                return siNext;
            }
        }
    }

    // Initialize _SurfaceInteraction_ after _Shape_ intersection
    si->intr.SetIntersectionProperties(material, areaLight, &mediumInterface, r.medium);

    return si;
}